

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

void __thiscall
cmsys::anon_unknown_3::SymbolProperties::Initialize(SymbolProperties *this,void *address)

{
  int iVar1;
  char *pcStack_38;
  int ierr;
  Dl_info info;
  void *address_local;
  SymbolProperties *this_local;
  
  this->Address = address;
  info.dli_saddr = address;
  iVar1 = dladdr(this->Address,&stack0xffffffffffffffc8);
  if (((iVar1 != 0) && (info.dli_fbase != (void *)0x0)) && (info.dli_sname != (char *)0x0)) {
    SetBinary(this,pcStack_38);
    SetFunction(this,(char *)info.dli_fbase);
  }
  return;
}

Assistant:

void SymbolProperties::Initialize(void* address)
{
  this->Address = address;
#  if defined(KWSYS_SYSTEMINFORMATION_HAS_SYMBOL_LOOKUP)
  // first fallback option can demangle c++ functions
  Dl_info info;
  int ierr = dladdr(this->Address, &info);
  if (ierr && info.dli_sname && info.dli_saddr) {
    this->SetBinary(info.dli_fname);
    this->SetFunction(info.dli_sname);
  }
#  else
// second fallback use builtin backtrace_symbols
// to decode the bactrace.
#  endif
}